

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

BranchReloc * __thiscall
IRBuilderAsmJs::CreateRelocRecord
          (IRBuilderAsmJs *this,BranchInstr *branchInstr,uint32 offset,uint32 targetOffset)

{
  BranchReloc *local_30;
  BranchReloc *reloc;
  
  local_30 = (BranchReloc *)new<Memory::JitArenaAllocator>(0x18,this->m_tempAlloc,0x3d6ef4);
  local_30->branchInstr = branchInstr;
  local_30->offset = targetOffset;
  local_30->isNotBackEdge = false;
  local_30->branchOffset = offset;
  SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->m_branchRelocList,&local_30);
  return local_30;
}

Assistant:

BranchReloc *
IRBuilderAsmJs::CreateRelocRecord(IR::BranchInstr * branchInstr, uint32 offset, uint32 targetOffset)
{
    BranchReloc * reloc = JitAnew(m_tempAlloc, BranchReloc, branchInstr, offset, targetOffset);
    m_branchRelocList->Prepend(reloc);
    return reloc;
}